

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O1

char * __thiscall format_iter::next(format_iter *this,size_t *len)

{
  vm_val_t *this_00;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  ushort *puVar4;
  size_t sVar5;
  ushort *unaff_R13;
  vm_val_t ele;
  vm_val_t local_48;
  vm_val_t local_38;
  
  *len = 0;
  do {
    if (this->mode != 0) {
      if (this->bidx < this->builtin_cnt) {
        sVar5 = strlen(this->builtin[this->bidx]);
        *len = sVar5;
        sVar3 = this->bidx;
        this->bidx = sVar3 + 1;
        return this->builtin[sVar3];
      }
      this->mode = 0;
    }
    if (this->custom_cnt <= this->cidx) {
      return (char *)0x0;
    }
    iVar2 = vm_val_t::is_listlike(this->custom);
    this_00 = this->custom;
    if (iVar2 == 0) {
      local_48.typ = this_00->typ;
      local_48._4_4_ = *(undefined4 *)&this_00->field_0x4;
      local_48.val = this_00->val;
LAB_0025cb0d:
      puVar4 = (ushort *)vm_val_t::get_as_string(&local_48);
      if (puVar4 == (ushort *)0x0) {
        unaff_R13 = (ushort *)0x0;
      }
      else {
        *len = (ulong)*puVar4;
        unaff_R13 = puVar4 + 1;
      }
      bVar1 = false;
    }
    else {
      sVar3 = this->cidx + 1;
      this->cidx = sVar3;
      local_38.typ = VM_INT;
      local_38.val.obj = (vm_obj_id_t)sVar3;
      vm_val_t::ll_index(this_00,&local_48,&local_38);
      if (local_48.typ != VM_NIL) goto LAB_0025cb0d;
      this->mode = 1;
      bVar1 = true;
    }
    if (!bVar1) {
      return (char *)unaff_R13;
    }
  } while( true );
}

Assistant:

const char *next(VMG_ size_t &len)
    {
        /* assume we won't find anythign */
        len = 0;

        /* keep going until we find something */
        for (;;)
        {
            if (mode == 0)
            {
                /* custom list - if exhausted, we're done */
                if (cidx >= custom_cnt)
                    return 0;

                /* get the next custom item, according to the source type */
                vm_val_t ele;
                if (custom->is_listlike(vmg0_))
                {
                    /* get the next list element */
                    custom->ll_index(vmg_ &ele, ++cidx);

                    /* if it's nil, switch to the builtin list */
                    if (ele.typ == VM_NIL)
                    {
                        mode = 1;
                        continue;
                    }
                }
                else
                {
                    /* it must be a single string */
                    ele = *custom;
                }

                /* retrieve the string value */
                const char *str = ele.get_as_string(vmg0_);
                if (str != 0)
                {
                    len = vmb_get_len(str);
                    str += VMB_LEN;
                }
                return str;
            }
            else
            {
                /* builtin list - if exhausted, return to the custom list */
                if (bidx >= builtin_cnt)
                {
                    mode = 0;
                    continue;
                }

                /* return the next builtin item */
                len = strlen(builtin[bidx]);
                return builtin[bidx++];
            }
        }
    }